

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O1

void __thiscall Arena_ConNoDecon_Test::TestBody(Arena_ConNoDecon_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *ptr;
  ostream *poVar2;
  undefined8 *puVar3;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr_2;
  long lVar4;
  bool bVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Arena arena;
  Message local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  string local_88;
  AssertHelper local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Arena local_40;
  
  memt::Arena::Arena(&local_40);
  if ((ulong)((long)local_40._blocks._block._end - (long)local_40._blocks._block._position) < 0x18)
  {
    memt::Arena::growCapacity(&local_40,0x18);
  }
  ptr = local_40._blocks._block._position;
  local_40._blocks._block._position = local_40._blocks._block._position + 0x18;
  lVar4 = 0;
  do {
    (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
    _count = (anonymous_namespace)::
             _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::_count + 1;
    bVar5 = (anonymous_namespace)::
            _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::_count == 0;
    *(long *)(ptr + lVar4) =
         (anonymous_namespace)::
         _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::_count;
    if (bVar5) {
      local_88._M_dataplus._M_p._0_1_ = 0x54;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)
                          &(anonymous_namespace)::
                           _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
                           _log_abi_cxx11_,(char *)&local_88,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = *(undefined8 *)(ptr + lVar4);
      __cxa_throw(puVar3,&unsigned_long::typeinfo,0);
    }
    local_88._M_dataplus._M_p._0_1_ = 0x2b;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)
                        &(anonymous_namespace)::
                         _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
                         _log_abi_cxx11_,(char *)&local_88,1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  if (local_40._blocks._block._position == local_40._blocks._block._begin) {
    memt::Arena::freeTopFromOldBlock(&local_40,ptr);
    ptr = local_40._blocks._block._position;
  }
  local_40._blocks._block._position = ptr;
  std::__cxx11::stringbuf::str();
  std::ios::clear((int)*(undefined8 *)
                        ((anonymous_namespace)::
                         _frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
                         _log_abi_cxx11_ + -0x18) + 0x15da88);
  paVar1 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)&DAT_0015da90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  (anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_ConNoDeconHelperTag,0ul>::
  _count = 0;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)&local_98,"ConNoDeconHelper::resetLog()","\"+1+2+3\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
             (char (*) [7])"+1+2+3");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
  }
  if (local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0xc9,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_60,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_88._M_dataplus._M_p + 8))();
    }
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010fa5f;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_90;
  }
  else {
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    local_60[0] = (internal)
                  (local_40._blocks._block._begin == local_40._blocks._block._position &&
                  local_40._blocks._block._previous == (Block *)0x0);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_58;
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_40._blocks._block._begin != local_40._blocks._block._position ||
        local_40._blocks._block._previous != (Block *)0x0) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)local_60,(AssertionResult *)"arena.isEmpty()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xca,local_88._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_68,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if ((long *)CONCAT71(local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_98.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_98.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    local_90 = local_58;
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010fa5f;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_90);
LAB_0010fa5f:
  memt::Arena::~Arena(&local_40);
  return;
}

Assistant:

TEST(Arena, ConNoDecon) {
  memt::Arena arena;
  arena.freeTop(arena.allocArray<ConNoDeconHelper>(3).first);
  ASSERT_EQ(ConNoDeconHelper::resetLog(), "+1+2+3");
  ASSERT_TRUE(arena.isEmpty());
}